

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatComputePattern4_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                      ,0x145,"void Cec_ManPatComputePattern4_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Cec_ManPatComputePattern4_rec(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Cec_ManPatComputePattern4_rec(p,pGVar2);
    }
  }
  return;
}

Assistant:

void Cec_ManPatComputePattern4_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin0(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin1(pObj) );
}